

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

pair<unsigned_long,_int> __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::_Pool::
Release(_Pool *this,
       Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_> *pNode
       )

{
  pair<unsigned_long,_int> *ppVar1;
  Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_> *in_RSI;
  long in_RDI;
  pair<unsigned_long,_int> pVar2;
  pair<unsigned_long,_int> result;
  Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
  *local_20 [2];
  unsigned_long local_10;
  undefined4 local_8;
  undefined4 uStack_4;
  
  local_20[0] = in_RSI;
  ppVar1 = Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>::
           value(in_RSI);
  local_10 = ppVar1->first;
  local_8 = (undefined4)*(undefined8 *)&ppVar1->second;
  uStack_4 = (undefined4)((ulong)*(undefined8 *)&ppVar1->second >> 0x20);
  std::
  swap<duckdb_skiplistlib::skip_list::Node<std::pair<unsigned_long,int>,duckdb::SkipLess<std::pair<unsigned_long,int>>>*>
            (local_20,(Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_>
                       **)(in_RDI + 8));
  if (local_20[0] !=
      (Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_> *)0x0)
  {
    ~Node((Node<std::pair<unsigned_long,_int>,_duckdb::SkipLess<std::pair<unsigned_long,_int>_>_> *)
          0x1d0d3c0);
    operator_delete(local_20[0]);
  }
  pVar2.second = local_8;
  pVar2.first = local_10;
  pVar2._12_4_ = 0;
  return pVar2;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}